

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cpp
# Opt level: O0

shared_ptr<cppnet::Timer> cppnet::MakeTimer1Min(void)

{
  element_type *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<cppnet::Timer> *in_RDI;
  shared_ptr<cppnet::Timer> sVar1;
  shared_ptr<cppnet::TimerContainer> local_68 [2];
  undefined4 local_48;
  TIME_UNIT local_44;
  undefined1 local_40 [8];
  shared_ptr<cppnet::TimerContainer> timer;
  TIME_UNIT local_28 [2];
  undefined1 local_20 [8];
  shared_ptr<cppnet::TimerContainer> sec_sub;
  
  local_28[0] = 0;
  local_28[1] = 0;
  timer.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _4_4_ = 1;
  timer.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _0_4_ = 1000;
  std::make_shared<cppnet::TimerContainer,decltype(nullptr),cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            ((void **)local_20,local_28,
             (TIME_UNIT *)
             ((long)&timer.super___shared_ptr<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 4));
  local_44 = TU_SECOND;
  local_48 = 60000;
  std::
  make_shared<cppnet::TimerContainer,std::shared_ptr<cppnet::TimerContainer>&,cppnet::TIME_UNIT,cppnet::TIME_UNIT>
            ((shared_ptr<cppnet::TimerContainer> *)local_40,(TIME_UNIT *)local_20,&local_44);
  this = std::__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
         ::operator->((__shared_ptr_access<cppnet::TimerContainer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::shared_ptr<cppnet::TimerContainer>::shared_ptr
            (local_68,(shared_ptr<cppnet::TimerContainer> *)local_40);
  TimerContainer::SetRootTimer(this,local_68);
  std::shared_ptr<cppnet::TimerContainer>::~shared_ptr(local_68);
  std::shared_ptr<cppnet::Timer>::shared_ptr<cppnet::TimerContainer,void>
            (in_RDI,(shared_ptr<cppnet::TimerContainer> *)local_40);
  std::shared_ptr<cppnet::TimerContainer>::~shared_ptr
            ((shared_ptr<cppnet::TimerContainer> *)local_40);
  std::shared_ptr<cppnet::TimerContainer>::~shared_ptr
            ((shared_ptr<cppnet::TimerContainer> *)local_20);
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)in_RDI;
  return (shared_ptr<cppnet::Timer>)
         sVar1.super___shared_ptr<cppnet::Timer,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Timer> MakeTimer1Min() {
    auto sec_sub = std::make_shared<TimerContainer>(nullptr, TU_MILLISECOND, TU_SECOND);
    auto timer = std::make_shared<TimerContainer>(sec_sub, TU_SECOND, TU_MINUTE);
    sec_sub->SetRootTimer(timer);
    return timer;
}